

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O3

void __thiscall TasGrid::GridSequence::write<true>(GridSequence *this,ostream *os)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  char cflag;
  char cflag_1;
  char cflag_2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  IO::writeNumbers<true,(TasGrid::IO::IOPad)1,int,int>
            ((ostream *)os,(this->super_BaseCanonicalGrid).num_dimensions,
             (this->super_BaseCanonicalGrid).num_outputs);
  IO::writeRule<true>(this->rule,(ostream *)os);
  uVar1 = 0x79;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = 0x6e;
  }
  uStack_28._0_6_ = CONCAT15(uVar1,(undefined5)uStack_28);
  ::std::ostream::write((char *)os,(long)&uStack_28 + 5);
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).points,(ostream *)os);
  }
  uVar1 = 0x79;
  if ((this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = 0x6e;
  }
  uStack_28._0_7_ = CONCAT16(uVar1,(undefined6)uStack_28);
  ::std::ostream::write((char *)os,(long)&uStack_28 + 6);
  if ((this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).needed,(ostream *)os);
  }
  uVar1 = 0x79;
  if ((this->surpluses).num_strips == 0) {
    uVar1 = 0x6e;
  }
  uStack_28 = CONCAT17(uVar1,(undefined7)uStack_28);
  ::std::ostream::write((char *)os,(long)&uStack_28 + 7);
  if ((this->surpluses).num_strips != 0) {
    ::std::ostream::write
              ((char *)os,
               (long)(this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  if (0 < (this->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::write<true>(&(this->super_BaseCanonicalGrid).values,(ostream *)os);
  }
  return;
}

Assistant:

void GridSequence::write(std::ostream &os) const{
    if (iomode == mode_ascii){ os << std::scientific; os.precision(17); }
    IO::writeNumbers<iomode, IO::pad_rspace>(os, num_dimensions, num_outputs);
    IO::writeRule<iomode>(rule, os);

    IO::writeFlag<iomode, IO::pad_auto>(!points.empty(), os);
    if (!points.empty()) points.write<iomode>(os);
    IO::writeFlag<iomode, IO::pad_auto>(!needed.empty(), os);
    if (!needed.empty()) needed.write<iomode>(os);

    IO::writeFlag<iomode, IO::pad_auto>(!surpluses.empty(), os);
    if (!surpluses.empty()) surpluses.writeVector<iomode, IO::pad_line>(os);

    if (num_outputs > 0) values.write<iomode>(os);
}